

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O0

void use_rtti(void)

{
  ostream *poVar1;
  Grand *pGVar2;
  long lVar3;
  long *local_50;
  bad_cast *err;
  Superb *rs;
  int i;
  Superb *ps;
  Grand *pg;
  
  std::operator<<((ostream *)&std::cout,"rtti:\n");
  rs._4_4_ = 0;
  while( true ) {
    if (4 < rs._4_4_) {
      return;
    }
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,rs._4_4_);
    std::operator<<(poVar1,":\t\n");
    pGVar2 = get_one();
    (**pGVar2->_vptr_Grand)();
    if (pGVar2 == (Grand *)0x0) {
      local_50 = (long *)0x0;
    }
    else {
      local_50 = (long *)__dynamic_cast(pGVar2,&L15_5::Grand::typeinfo,&L15_5::Superb::typeinfo,0);
    }
    if (local_50 == (long *)0x0) {
      std::operator<<((ostream *)&std::cout,"I am not able to say...\n\n");
    }
    else {
      (**(code **)(*local_50 + 0x10))();
      std::operator<<((ostream *)&std::cout,"\n");
    }
    lVar3 = __dynamic_cast(pGVar2,&L15_5::Grand::typeinfo,&L15_5::Superb::typeinfo,0);
    if (lVar3 == 0) break;
    std::operator<<((ostream *)&std::cout,"Success cast to ref...\n");
    rs._4_4_ = rs._4_4_ + 1;
  }
  __cxa_bad_cast();
}

Assistant:

void use_rtti() {
    std::cout << "rtti:\n";

    using namespace L15_5;
    using std::cout;
    using std::endl;
    using std::rand;

    Grand * pg;
    Superb * ps;
    for(int i = 0; i < 5; i++) {
        std::cout << i << ":\t\n";
        pg = get_one();
        //  pg certainly have 'speak'
        pg->speak();
        //  check if it is able to cast to derived class pointer
        if (ps = dynamic_cast<Superb *>(pg)) {
            ps->say();
            cout << "\n";
        } else {
            cout << "I am not able to say...\n\n";
        }

        //  since pg is address, *pg is the value behind the adress
//        Grand & rg = *pg;

        try {
            Superb & rs = dynamic_cast<Superb &>(*pg);
            cout << "Success cast to ref...\n";
        } catch (std::bad_cast & err) {
            cout << "Error: " << err.what();
        }
    }
}